

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_cmp_mpi(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  short sVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = (ulong)X->n;
  do {
    uVar5 = uVar2;
    if (uVar5 == 0) break;
    uVar2 = uVar5 - 1;
  } while (X->p[uVar5 - 1] == 0);
  uVar2 = (ulong)Y->n;
  do {
    uVar4 = uVar2;
    if (uVar4 == 0) break;
    uVar2 = uVar4 - 1;
  } while (Y->p[uVar4 - 1] == 0);
  iVar3 = 0;
  if (uVar4 != 0 || uVar5 != 0) {
    if (uVar4 < uVar5) {
      iVar3 = (int)X->s;
    }
    else if (uVar5 < uVar4) {
      iVar3 = -(int)Y->s;
    }
    else {
      sVar1 = X->s;
      if (sVar1 < 1) {
        if (sVar1 != 0 && 0 < Y->s) {
          return -1;
        }
      }
      else if (Y->s < 0) {
        return 1;
      }
      do {
        bVar6 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar6) {
          return 0;
        }
        if (Y->p[uVar5] < X->p[uVar5]) {
          return (int)sVar1;
        }
      } while (Y->p[uVar5] <= X->p[uVar5]);
      iVar3 = -(int)sVar1;
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_cmp_mpi(const mbedtls_mpi *X, const mbedtls_mpi *Y)
{
    size_t i, j;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(Y != NULL);

    for (i = X->n; i > 0; i--) {
        if (X->p[i - 1] != 0) {
            break;
        }
    }

    for (j = Y->n; j > 0; j--) {
        if (Y->p[j - 1] != 0) {
            break;
        }
    }

    if (i == 0 && j == 0) {
        return 0;
    }

    if (i > j) {
        return X->s;
    }
    if (j > i) {
        return -Y->s;
    }

    if (X->s > 0 && Y->s < 0) {
        return 1;
    }
    if (Y->s > 0 && X->s < 0) {
        return -1;
    }

    for (; i > 0; i--) {
        if (X->p[i - 1] > Y->p[i - 1]) {
            return X->s;
        }
        if (X->p[i - 1] < Y->p[i - 1]) {
            return -X->s;
        }
    }

    return 0;
}